

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nng_url_parse(nng_url **urlp,char *raw)

{
  nng_url *url_00;
  int rv;
  nng_url *url;
  char *raw_local;
  nng_url **urlp_local;
  
  url_00 = (nng_url *)nni_zalloc(200);
  if (url_00 == (nng_url *)0x0) {
    urlp_local._4_4_ = 2;
  }
  else {
    urlp_local._4_4_ = nni_url_parse_inline(url_00,raw);
    if (urlp_local._4_4_ == 0) {
      *urlp = url_00;
      urlp_local._4_4_ = 0;
    }
    else {
      nni_free(url_00,200);
    }
  }
  return urlp_local._4_4_;
}

Assistant:

int
nng_url_parse(nng_url **urlp, const char *raw)
{
	nng_url *url;
	int      rv;

	if ((url = NNI_ALLOC_STRUCT(url)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_parse_inline(url, raw)) != 0) {
		NNI_FREE_STRUCT(url);
		return (rv);
	}
	*urlp = url;
	return (0);
}